

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

char * tcu::astc::getBlockTestTypeName(BlockTestType testType)

{
  char *pcStack_10;
  BlockTestType testType_local;
  
  switch(testType) {
  case BLOCK_TEST_TYPE_VOID_EXTENT_LDR:
    pcStack_10 = "void_extent_ldr";
    break;
  case BLOCK_TEST_TYPE_VOID_EXTENT_HDR:
    pcStack_10 = "void_extent_hdr";
    break;
  case BLOCK_TEST_TYPE_WEIGHT_GRID:
    pcStack_10 = "weight_grid";
    break;
  case BLOCK_TEST_TYPE_WEIGHT_ISE:
    pcStack_10 = "weight_ise";
    break;
  case BLOCK_TEST_TYPE_CEMS:
    pcStack_10 = "color_endpoint_modes";
    break;
  case BLOCK_TEST_TYPE_PARTITION_SEED:
    pcStack_10 = "partition_pattern_index";
    break;
  case BLOCK_TEST_TYPE_ENDPOINT_VALUE_LDR:
    pcStack_10 = "endpoint_value_ldr";
    break;
  case BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_NO_15:
    pcStack_10 = "endpoint_value_hdr_cem_not_15";
    break;
  case BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_15:
    pcStack_10 = "endpoint_value_hdr_cem_15";
    break;
  case BLOCK_TEST_TYPE_ENDPOINT_ISE:
    pcStack_10 = "endpoint_ise";
    break;
  case BLOCK_TEST_TYPE_CCS:
    pcStack_10 = "color_component_selector";
    break;
  case BLOCK_TEST_TYPE_RANDOM:
    pcStack_10 = "random";
    break;
  default:
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

const char* getBlockTestTypeName (BlockTestType testType)
{
	switch (testType)
	{
		case BLOCK_TEST_TYPE_VOID_EXTENT_LDR:			return "void_extent_ldr";
		case BLOCK_TEST_TYPE_VOID_EXTENT_HDR:			return "void_extent_hdr";
		case BLOCK_TEST_TYPE_WEIGHT_GRID:				return "weight_grid";
		case BLOCK_TEST_TYPE_WEIGHT_ISE:				return "weight_ise";
		case BLOCK_TEST_TYPE_CEMS:						return "color_endpoint_modes";
		case BLOCK_TEST_TYPE_PARTITION_SEED:			return "partition_pattern_index";
		case BLOCK_TEST_TYPE_ENDPOINT_VALUE_LDR:		return "endpoint_value_ldr";
		case BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_NO_15:	return "endpoint_value_hdr_cem_not_15";
		case BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_15:		return "endpoint_value_hdr_cem_15";
		case BLOCK_TEST_TYPE_ENDPOINT_ISE:				return "endpoint_ise";
		case BLOCK_TEST_TYPE_CCS:						return "color_component_selector";
		case BLOCK_TEST_TYPE_RANDOM:					return "random";
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}